

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

double annAspectRatio(int dim,ANNorthRect *bnd_box)

{
  double dVar1;
  int d;
  ANNcoord max_length;
  ANNcoord min_length;
  ANNcoord length;
  ANNorthRect *bnd_box_local;
  int dim_local;
  
  max_length = *bnd_box->hi - *bnd_box->lo;
  min_length = max_length;
  for (d = 0; d < dim; d = d + 1) {
    dVar1 = bnd_box->hi[d] - bnd_box->lo[d];
    if (dVar1 < min_length) {
      min_length = dVar1;
    }
    if (max_length < dVar1) {
      max_length = dVar1;
    }
  }
  return max_length / min_length;
}

Assistant:

double annAspectRatio(int dim,                     // dimension
                      const ANNorthRect &bnd_box)  // bounding cube
{
    ANNcoord length = bnd_box.hi[0] - bnd_box.lo[0];
    ANNcoord min_length = length;  // min side length
    ANNcoord max_length = length;  // max side length
    for (int d = 0; d < dim; d++) {
        length = bnd_box.hi[d] - bnd_box.lo[d];
        if (length < min_length) min_length = length;
        if (length > max_length) max_length = length;
    }
    return max_length / min_length;
}